

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

CharString * __thiscall CFFFileInput::GetGlobalSubr(CFFFileInput *this,long inSubrIndex)

{
  CFFFileInput *pCVar1;
  CharString *returnValue;
  long lStack_20;
  unsigned_short biasedIndex;
  long inSubrIndex_local;
  CFFFileInput *this_local;
  
  lStack_20 = inSubrIndex;
  inSubrIndex_local = (long)this;
  returnValue._6_2_ = GetBiasedIndex(this,(this->mGlobalSubrs).mCharStringsCount,inSubrIndex);
  if (returnValue._6_2_ < (this->mGlobalSubrs).mCharStringsCount) {
    pCVar1 = (CFFFileInput *)((this->mGlobalSubrs).mCharStringsIndex + (int)(uint)returnValue._6_2_)
    ;
    this_local = pCVar1;
    if (this->mCurrentDependencies != (CharString2Dependencies *)0x0) {
      std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
                (&this->mCurrentDependencies->mGlobalSubrs,
                 (value_type_conflict4 *)((long)&returnValue + 6));
    }
  }
  else {
    this_local = (CFFFileInput *)0x0;
  }
  return (CharString *)this_local;
}

Assistant:

CharString* CFFFileInput::GetGlobalSubr(long inSubrIndex)
{
	unsigned short biasedIndex = GetBiasedIndex(mGlobalSubrs.mCharStringsCount,inSubrIndex);	

	if(biasedIndex < mGlobalSubrs.mCharStringsCount)
	{
		CharString* returnValue = mGlobalSubrs.mCharStringsIndex + biasedIndex;
		if(mCurrentDependencies)
			mCurrentDependencies->mGlobalSubrs.insert(biasedIndex);
		return returnValue;
	}
	else
		return NULL;
}